

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O1

bool __thiscall CCollision::TestBox(CCollision *this,vec2 Pos,vec2 Size,int Flag)

{
  bool bVar1;
  float fVar2;
  float x;
  float fVar3;
  float y;
  
  fVar3 = Size.field_0.x * 0.5;
  fVar2 = Size.field_1.y * 0.5;
  x = Pos.field_0.x - fVar3;
  y = Pos.field_1.y - fVar2;
  bVar1 = CheckPoint(this,x,y,Flag);
  if (!bVar1) {
    fVar3 = Pos.field_0.x + fVar3;
    bVar1 = CheckPoint(this,fVar3,y,Flag);
    if (!bVar1) {
      fVar2 = Pos.field_1.y + fVar2;
      bVar1 = CheckPoint(this,x,fVar2,Flag);
      if (!bVar1) {
        bVar1 = CheckPoint(this,fVar3,fVar2,Flag);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool CCollision::TestBox(vec2 Pos, vec2 Size, int Flag) const
{
	Size *= 0.5f;
	if(CheckPoint(Pos.x-Size.x, Pos.y-Size.y, Flag))
		return true;
	if(CheckPoint(Pos.x+Size.x, Pos.y-Size.y, Flag))
		return true;
	if(CheckPoint(Pos.x-Size.x, Pos.y+Size.y, Flag))
		return true;
	if(CheckPoint(Pos.x+Size.x, Pos.y+Size.y, Flag))
		return true;
	return false;
}